

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

void process_extra(char *p,size_t extra_length,zip_entry *zip_entry)

{
  byte bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  uint local_44;
  wchar_t gidsize;
  wchar_t uidsize;
  uint32_t comment_length;
  uint32_t external_attributes;
  uint32_t internal_attributes;
  wchar_t bitmap_last;
  wchar_t bitmap;
  wchar_t flags;
  unsigned_short datasize;
  unsigned_short headerid;
  uint offset;
  zip_entry *zip_entry_local;
  size_t extra_length_local;
  char *p_local;
  
  flags = L'\0';
  do {
    if (extra_length - 4 <= (ulong)(uint)flags) {
      return;
    }
    uVar2 = archive_le16dec(p + (uint)flags);
    uVar3 = archive_le16dec(p + (ulong)(uint)flags + 2);
    wVar4 = flags + L'\x04';
    if (extra_length < (uint)(wVar4 + (uint)uVar3)) {
      return;
    }
    bitmap._0_2_ = uVar3;
    if (uVar2 == 1) {
      zip_entry->flags = zip_entry->flags | 1;
      if (zip_entry->uncompressed_size == 0xffffffff) {
        if (uVar3 < 8) goto LAB_007fc7aa;
        uVar6 = archive_le64dec(p + (uint)wVar4);
        zip_entry->uncompressed_size = uVar6;
        bitmap._0_2_ = uVar3 - 8;
        wVar4 = flags + L'\f';
      }
      flags = wVar4;
      if (zip_entry->compressed_size == 0xffffffff) {
        wVar4 = flags;
        if ((ushort)bitmap < 8) goto LAB_007fc7aa;
        uVar6 = archive_le64dec(p + (uint)flags);
        zip_entry->compressed_size = uVar6;
        flags = flags + L'\b';
        bitmap._0_2_ = (ushort)bitmap - 8;
      }
      wVar4 = flags;
      if ((zip_entry->local_header_offset == 0xffffffff) && (7 < (ushort)bitmap)) {
        uVar6 = archive_le64dec(p + (uint)flags);
        zip_entry->local_header_offset = uVar6;
        bitmap._0_2_ = (ushort)bitmap - 8;
        wVar4 = flags + L'\b';
      }
    }
    else if (uVar2 == 0x5455) {
      bVar1 = p[(uint)wVar4];
      wVar4 = flags + L'\x05';
      bitmap._0_2_ = uVar3 - 1;
      if ((bVar1 & 1) != 0) {
        if ((ushort)bitmap < 4) goto LAB_007fc7aa;
        uVar5 = archive_le32dec(p + (uint)wVar4);
        zip_entry->mtime = (ulong)uVar5;
        bitmap._0_2_ = uVar3 - 5;
        wVar4 = flags + L'\t';
      }
      flags = wVar4;
      if ((bVar1 & 2) != 0) {
        wVar4 = flags;
        if ((ushort)bitmap < 4) goto LAB_007fc7aa;
        uVar5 = archive_le32dec(p + (uint)flags);
        zip_entry->atime = (ulong)uVar5;
        flags = flags + L'\x04';
        bitmap._0_2_ = (ushort)bitmap - 4;
      }
      wVar4 = flags;
      if (((bVar1 & 4) != 0) && (3 < (ushort)bitmap)) {
        uVar5 = archive_le32dec(p + (uint)flags);
        zip_entry->ctime = (ulong)uVar5;
        bitmap._0_2_ = (ushort)bitmap - 4;
        wVar4 = flags + L'\x04';
      }
    }
    else if (uVar2 == 0x5855) {
      if (7 < uVar3) {
        uVar5 = archive_le32dec(p + (uint)wVar4);
        zip_entry->atime = (ulong)uVar5;
        uVar5 = archive_le32dec(p + (ulong)(uint)wVar4 + 4);
        zip_entry->mtime = (ulong)uVar5;
      }
      if (0xb < uVar3) {
        uVar3 = archive_le16dec(p + (ulong)(uint)wVar4 + 8);
        zip_entry->uid = (ulong)uVar3;
        uVar3 = archive_le16dec(p + (ulong)(uint)wVar4 + 10);
        zip_entry->gid = (ulong)uVar3;
      }
    }
    else if (uVar2 == 0x6c78) {
      if (uVar3 != 0) {
        bVar1 = p[(uint)wVar4];
        flags = flags + L'\x05';
        external_attributes = (uint32_t)bVar1;
        while (bitmap._0_2_ = uVar3 - 1, (external_attributes & 0x80) != 0 && (ushort)bitmap != 0) {
          uVar7 = (ulong)(uint)flags;
          flags = flags + L'\x01';
          uVar3 = (ushort)bitmap;
          external_attributes = (uint32_t)p[uVar7];
        }
        if ((bVar1 & 1) != 0) {
          wVar4 = flags;
          if ((ushort)bitmap < 2) goto LAB_007fc7aa;
          uVar2 = archive_le16dec(p + (uint)flags);
          zip_entry->system = (uchar)(uVar2 >> 8);
          flags = flags + L'\x02';
          bitmap._0_2_ = uVar3 - 3;
        }
        if ((bVar1 & 2) != 0) {
          wVar4 = flags;
          if ((ushort)bitmap < 2) goto LAB_007fc7aa;
          archive_le16dec(p + (uint)flags);
          flags = flags + L'\x02';
          bitmap._0_2_ = (ushort)bitmap - 2;
        }
        if ((bVar1 & 4) != 0) {
          wVar4 = flags;
          if ((ushort)bitmap < 4) goto LAB_007fc7aa;
          uVar5 = archive_le32dec(p + (uint)flags);
          if (zip_entry->system == '\x03') {
            zip_entry->mode = (uint16_t)(uVar5 >> 0x10);
          }
          flags = flags + L'\x04';
          bitmap._0_2_ = (ushort)bitmap - 4;
        }
        wVar4 = flags;
        if (((bVar1 & 8) != 0) && (1 < (ushort)bitmap)) {
          uVar3 = archive_le16dec(p + (uint)flags);
          bitmap._0_2_ = (ushort)bitmap - 2;
          wVar4 = flags + L'\x02';
          if ((uint)uVar3 <= (uint)(ushort)bitmap) {
            bitmap._0_2_ = (ushort)bitmap - uVar3;
            wVar4 = (uint)uVar3 + flags + L'\x02';
          }
        }
      }
    }
    else if (uVar2 == 0x7855) {
      if (1 < uVar3) {
        uVar2 = archive_le16dec(p + (uint)wVar4);
        zip_entry->uid = (ulong)uVar2;
      }
      if (3 < uVar3) {
        uVar3 = archive_le16dec(p + (ulong)(uint)wVar4 + 2);
        zip_entry->gid = (ulong)uVar3;
      }
    }
    else if (uVar2 == 0x7875) {
      local_44 = 0;
      if ((uVar3 != 0) && (p[(uint)wVar4] == '\x01')) {
        if (3 < uVar3) {
          local_44 = (uint)(byte)p[(uint)(flags + L'\x05')];
          if (local_44 == 2) {
            uVar2 = archive_le16dec(p + (ulong)(uint)wVar4 + 2);
            zip_entry->uid = (ulong)uVar2;
          }
          else if ((local_44 == 4) && (5 < uVar3)) {
            uVar5 = archive_le32dec(p + (ulong)(uint)wVar4 + 2);
            zip_entry->uid = (ulong)uVar5;
          }
        }
        if (local_44 + 5 <= (uint)uVar3) {
          if (p[(uint)(flags + L'\x06' + local_44)] == '\x02') {
            uVar3 = archive_le16dec(p + (long)(int)local_44 + (ulong)(uint)wVar4 + 3);
            zip_entry->gid = (ulong)uVar3;
          }
          else if ((p[(uint)(flags + L'\x06' + local_44)] == '\x04') &&
                  (local_44 + 7 <= (uint)uVar3)) {
            uVar5 = archive_le32dec(p + (long)(int)local_44 + (ulong)(uint)wVar4 + 3);
            zip_entry->gid = (ulong)uVar5;
          }
        }
      }
    }
    else if (((uVar2 == 0x9901) && (p[(uint)(flags + L'\x06')] == 'A')) &&
            (p[(uint)(flags + L'\a')] == 'E')) {
      uVar3 = archive_le16dec(p + (uint)wVar4);
      (zip_entry->aes_extra).vendor = (uint)uVar3;
      (zip_entry->aes_extra).strength = (int)p[(uint)(flags + L'\b')];
      (zip_entry->aes_extra).compression = p[(uint)(flags + L'\t')];
    }
LAB_007fc7aa:
    flags = wVar4;
    flags = (uint)(ushort)bitmap + flags;
  } while( true );
}

Assistant:

static void
process_extra(const char *p, size_t extra_length, struct zip_entry* zip_entry)
{
	unsigned offset = 0;

	while (offset < extra_length - 4) {
		unsigned short headerid = archive_le16dec(p + offset);
		unsigned short datasize = archive_le16dec(p + offset + 2);

		offset += 4;
		if (offset + datasize > extra_length)
			break;
#ifdef DEBUG
		fprintf(stderr, "Header id 0x%04x, length %d\n",
		    headerid, datasize);
#endif
		switch (headerid) {
		case 0x0001:
			/* Zip64 extended information extra field. */
			zip_entry->flags |= LA_USED_ZIP64;
			if (zip_entry->uncompressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->uncompressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->compressed_size == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->compressed_size =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			if (zip_entry->local_header_offset == 0xffffffff) {
				if (datasize < 8)
					break;
				zip_entry->local_header_offset =
				    archive_le64dec(p + offset);
				offset += 8;
				datasize -= 8;
			}
			/* archive_le32dec(p + offset) gives disk
			 * on which file starts, but we don't handle
			 * multi-volume Zip files. */
			break;
#ifdef DEBUG
		case 0x0017:
		{
			/* Strong encryption field. */
			if (archive_le16dec(p + offset) == 2) {
				unsigned algId =
					archive_le16dec(p + offset + 2);
				unsigned bitLen =
					archive_le16dec(p + offset + 4);
				int	 flags =
					archive_le16dec(p + offset + 6);
				fprintf(stderr, "algId=0x%04x, bitLen=%u, "
				    "flgas=%d\n", algId, bitLen,flags);
			}
			break;
		}
#endif
		case 0x5455:
		{
			/* Extended time field "UT". */
			int flags = p[offset];
			offset++;
			datasize--;
			/* Flag bits indicate which dates are present. */
			if (flags & 0x01)
			{
#ifdef DEBUG
				fprintf(stderr, "mtime: %lld -> %d\n",
				    (long long)zip_entry->mtime,
				    archive_le32dec(p + offset));
#endif
				if (datasize < 4)
					break;
				zip_entry->mtime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x02)
			{
				if (datasize < 4)
					break;
				zip_entry->atime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			if (flags & 0x04)
			{
				if (datasize < 4)
					break;
				zip_entry->ctime = archive_le32dec(p + offset);
				offset += 4;
				datasize -= 4;
			}
			break;
		}
		case 0x5855:
		{
			/* Info-ZIP Unix Extra Field (old version) "UX". */
			if (datasize >= 8) {
				zip_entry->atime = archive_le32dec(p + offset);
				zip_entry->mtime =
				    archive_le32dec(p + offset + 4);
			}
			if (datasize >= 12) {
				zip_entry->uid =
				    archive_le16dec(p + offset + 8);
				zip_entry->gid =
				    archive_le16dec(p + offset + 10);
			}
			break;
		}
		case 0x6c78:
		{
			/* Experimental 'xl' field */
			/*
			 * Introduced Dec 2013 to provide a way to
			 * include external file attributes (and other
			 * fields that ordinarily appear only in
			 * central directory) in local file header.
			 * This provides file type and permission
			 * information necessary to support full
			 * streaming extraction.  Currently being
			 * discussed with other Zip developers
			 * ... subject to change.
			 *
			 * Format:
			 *  The field starts with a bitmap that specifies
			 *  which additional fields are included.  The
			 *  bitmap is variable length and can be extended in
			 *  the future.
			 *
			 *  n bytes - feature bitmap: first byte has low-order
			 *    7 bits.  If high-order bit is set, a subsequent
			 *    byte holds the next 7 bits, etc.
			 *
			 *  if bitmap & 1, 2 byte "version made by"
			 *  if bitmap & 2, 2 byte "internal file attributes"
			 *  if bitmap & 4, 4 byte "external file attributes"
			 *  if bitmap * 7, 2 byte comment length + n byte comment
			 */
			int bitmap, bitmap_last;

			if (datasize < 1)
				break;
			bitmap_last = bitmap = 0xff & p[offset];
			offset += 1;
			datasize -= 1;

			/* We only support first 7 bits of bitmap; skip rest. */
			while ((bitmap_last & 0x80) != 0
			    && datasize >= 1) {
				bitmap_last = p[offset];
				offset += 1;
				datasize -= 1;
			}

			if (bitmap & 1) {
				/* 2 byte "version made by" */
				if (datasize < 2)
					break;
				zip_entry->system
				    = archive_le16dec(p + offset) >> 8;
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 2) {
				/* 2 byte "internal file attributes" */
				uint32_t internal_attributes;
				if (datasize < 2)
					break;
				internal_attributes
				    = archive_le16dec(p + offset);
				/* Not used by libarchive at present. */
				(void)internal_attributes; /* UNUSED */
				offset += 2;
				datasize -= 2;
			}
			if (bitmap & 4) {
				/* 4 byte "external file attributes" */
				uint32_t external_attributes;
				if (datasize < 4)
					break;
				external_attributes
				    = archive_le32dec(p + offset);
				if (zip_entry->system == 3) {
					zip_entry->mode
					    = external_attributes >> 16;
				}
				offset += 4;
				datasize -= 4;
			}
			if (bitmap & 8) {
				/* 2 byte comment length + comment */
				uint32_t comment_length;
				if (datasize < 2)
					break;
				comment_length
				    = archive_le16dec(p + offset);
				offset += 2;
				datasize -= 2;

				if (datasize < comment_length)
					break;
				/* Comment is not supported by libarchive */
				offset += comment_length;
				datasize -= comment_length;
			}
			break;
		}
		case 0x7855:
			/* Info-ZIP Unix Extra Field (type 2) "Ux". */
#ifdef DEBUG
			fprintf(stderr, "uid %d gid %d\n",
			    archive_le16dec(p + offset),
			    archive_le16dec(p + offset + 2));
#endif
			if (datasize >= 2)
				zip_entry->uid = archive_le16dec(p + offset);
			if (datasize >= 4)
				zip_entry->gid =
				    archive_le16dec(p + offset + 2);
			break;
		case 0x7875:
		{
			/* Info-Zip Unix Extra Field (type 3) "ux". */
			int uidsize = 0, gidsize = 0;

			/* TODO: support arbitrary uidsize/gidsize. */
			if (datasize >= 1 && p[offset] == 1) {/* version=1 */
				if (datasize >= 4) {
					/* get a uid size. */
					uidsize = 0xff & (int)p[offset+1];
					if (uidsize == 2)
						zip_entry->uid =
						    archive_le16dec(
						        p + offset + 2);
					else if (uidsize == 4 && datasize >= 6)
						zip_entry->uid =
						    archive_le32dec(
						        p + offset + 2);
				}
				if (datasize >= (2 + uidsize + 3)) {
					/* get a gid size. */
					gidsize = 0xff & (int)p[offset+2+uidsize];
					if (gidsize == 2)
						zip_entry->gid =
						    archive_le16dec(
						        p+offset+2+uidsize+1);
					else if (gidsize == 4 &&
					    datasize >= (2 + uidsize + 5))
						zip_entry->gid =
						    archive_le32dec(
						        p+offset+2+uidsize+1);
				}
			}
			break;
		}
		case 0x9901:
			/* WinZIp AES extra data field. */
			if (p[offset + 2] == 'A' && p[offset + 3] == 'E') {
				/* Vendor version. */
				zip_entry->aes_extra.vendor =
				    archive_le16dec(p + offset);
				/* AES encryption strength. */
				zip_entry->aes_extra.strength = p[offset + 4];
				/* Actual compression method. */
				zip_entry->aes_extra.compression =
				    p[offset + 5];
			}
			break;
		default:
			break;
		}
		offset += datasize;
	}
#ifdef DEBUG
	if (offset != extra_length)
	{
		fprintf(stderr,
		    "Extra data field contents do not match reported size!\n");
	}
#endif
}